

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

Translator * __thiscall
helics::ConnectorFederateManager::registerTranslator
          (ConnectorFederateManager *this,string_view name,string_view endpointType,
          string_view units)

{
  long *plVar1;
  string_view message;
  bool bVar2;
  StringMappedVector<helics::Translator,_(reference_stability)0,_5> *data_1;
  Federate **data;
  Translator *pTVar3;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  StringMappedVector<helics::Translator,_(reference_stability)0,_5> *in_RDI;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  handle trans;
  InterfaceHandle handle;
  char *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_fffffffffffffef8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff00;
  Federate **in_stack_ffffffffffffff08;
  string_view in_stack_ffffffffffffff18;
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  local_78 [3];
  InterfaceHandle local_2c [7];
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  plVar1 = (long *)(in_RDI->dataStorage).csize;
  local_2c[0].hid = (**(code **)(*plVar1 + 0x1e0))(plVar1,in_RSI,in_RDX,in_RCX,in_R8);
  bVar2 = InterfaceHandle::isValid(local_2c);
  if (!bVar2) {
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_fffffffffffffec8);
    message._M_str._0_7_ = in_stack_fffffffffffffee0;
    message._M_len = in_stack_fffffffffffffed8;
    message._M_str._7_1_ = in_stack_fffffffffffffee7;
    RegistrationFailure::RegistrationFailure((RegistrationFailure *)this_00,message);
    __cxa_throw(this_00,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(in_stack_fffffffffffffef8);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar2) {
    data_1 = gmlc::libguarded::
             lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
             ::operator->(local_78);
    plVar1 = (long *)(in_RDI->dataStorage).csize;
    data = (Federate **)(**(code **)(*plVar1 + 0x140))(plVar1,local_2c[0].hid);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_00000010);
    gmlc::containers::StringMappedVector<helics::Translator,(reference_stability)0,5>::
    insert<helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
              (in_RDI,in_stack_ffffffffffffff18,data,
               (basic_string_view<char,_std::char_traits<char>_> *)data_1,
               (InterfaceHandle *)in_stack_fffffffffffffef8);
  }
  else {
    gmlc::libguarded::
    lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator->(local_78);
    gmlc::containers::StringMappedVector<helics::Translator,(reference_stability)0,5>::
    insert<helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
              (in_RDI,in_stack_ffffffffffffff18,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (InterfaceHandle *)in_stack_fffffffffffffef8);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator->(local_78);
  pTVar3 = gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::back
                     ((StringMappedVector<helics::Translator,_(reference_stability)0,_5> *)0x30b091)
  ;
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
                  *)0x30b0a5);
  return pTVar3;
}

Assistant:

Translator& ConnectorFederateManager::registerTranslator(std::string_view name,
                                                         std::string_view endpointType,
                                                         std::string_view units)
{
    auto handle = coreObject->registerTranslator(name, endpointType, units);
    if (handle.isValid()) {
        auto trans = translators.lock();
        if (name.empty()) {
            trans->insert(coreObject->getHandleName(handle), fed, name, handle);
        } else {
            trans->insert(name, fed, name, handle);
        }
        return trans->back();
    }
    throw(RegistrationFailure("Unable to register translator"));
}